

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegionsBuilder.cpp
# Opt level: O3

void __thiscall ThreadRegionsBuilder::printNodes(ThreadRegionsBuilder *this,ostream *ostream)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->threadRegions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->threadRegions_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    ThreadRegion::printNodes(*(ThreadRegion **)(p_Var1 + 1),ostream);
  }
  return;
}

Assistant:

void ThreadRegionsBuilder::printNodes(std::ostream &ostream) const {
    for (auto *threadRegion : threadRegions_) {
        threadRegion->printNodes(ostream);
    }
}